

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Node.cpp
# Opt level: O2

void __thiscall Tjen::Node::Node(Node *this,Node *n)

{
  _Deque_base<char,_std::allocator<char>_> _Stack_78;
  
  (this->name)._M_dataplus._M_p = (pointer)&(this->name).field_2;
  (this->name)._M_string_length = 0;
  (this->name).field_2._M_local_buf[0] = '\0';
  (this->transitions).
  super__Vector_base<Tjen::Node::Transition_*,_std::allocator<Tjen::Node::Transition_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->transitions).
  super__Vector_base<Tjen::Node::Transition_*,_std::allocator<Tjen::Node::Transition_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->transitions).
  super__Vector_base<Tjen::Node::Transition_*,_std::allocator<Tjen::Node::Transition_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::stack<char,std::deque<char,std::allocator<char>>>::
  stack<std::deque<char,std::allocator<char>>,void>(&this->stack);
  std::deque<char,_std::allocator<char>_>::deque
            ((deque<char,_std::allocator<char>_> *)&_Stack_78,&(n->stack).c);
  std::deque<char,_std::allocator<char>_>::_M_move_assign1(&(this->stack).c,&_Stack_78);
  std::_Deque_base<char,_std::allocator<char>_>::~_Deque_base(&_Stack_78);
  std::__cxx11::string::_M_assign((string *)this);
  std::vector<Tjen::Node::Transition_*,_std::allocator<Tjen::Node::Transition_*>_>::operator=
            (&this->transitions,&n->transitions);
  return;
}

Assistant:

Tjen::Node::Node(Node *n) {
    stack = n->getStack();
    name = n->getName();
    transitions = n->getTransitions();
}